

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void do_osc(Terminal *term)

{
  undefined1 uVar1;
  undefined1 uVar2;
  wchar_t wVar3;
  uint uVar4;
  Ldisc *ldisc;
  int iVar5;
  char *pcVar6;
  rgb *prVar7;
  size_t sVar8;
  char *reply_buf;
  rgb colour;
  uint index;
  Terminal *term_local;
  
  if ((term->osc_w & 1U) != 0) {
    while (wVar3 = term->osc_strlen, term->osc_strlen = wVar3 + L'\xffffffff', wVar3 != L'\0') {
      term->wordness[(byte)term->osc_string[term->osc_strlen]] = (short)term->esc_args[0];
    }
    return;
  }
  term->osc_string[term->osc_strlen] = '\0';
  switch(term->esc_args[0]) {
  case 0:
  case 1:
    if ((term->no_remote_wintitle & 1U) == 0) {
      safefree(term->icon_title);
      pcVar6 = dupstr(term->osc_string);
      term->icon_title = pcVar6;
      term->icontitle_codepage = term->ucsdata->line_codepage;
      term->win_icon_title_pending = true;
      term_schedule_update(term);
    }
    if (term->esc_args[0] == 1) {
      return;
    }
  case 2:
  case 0x15:
    if ((term->no_remote_wintitle & 1U) == 0) {
      safefree(term->window_title);
      pcVar6 = dupstr(term->osc_string);
      term->window_title = pcVar6;
      term->wintitle_codepage = term->ucsdata->line_codepage;
      term->win_title_pending = true;
      term_schedule_update(term);
    }
    break;
  case 4:
    if (((term->ldisc != (Ldisc *)0x0) && (iVar5 = strcmp(term->osc_string,"?"), iVar5 == 0)) &&
       (uVar4 = term->esc_args[1], uVar4 < 0x106)) {
      prVar7 = term->palette + uVar4;
      uVar1 = prVar7->r;
      uVar2 = prVar7->g;
      pcVar6 = dupprintf("\x1b]4;%u;rgb:%04x/%04x/%04x\a",(ulong)uVar4,
                         (ulong)((uint)(byte)uVar1 * 0x101),(ulong)((uint)(byte)uVar2 * 0x101),
                         (ulong)((uint)prVar7->b * 0x101));
      ldisc = term->ldisc;
      sVar8 = strlen(pcVar6);
      ldisc_send(ldisc,pcVar6,(wchar_t)sVar8,false);
      safefree(pcVar6);
    }
  }
  return;
}

Assistant:

static void do_osc(Terminal *term)
{
    if (term->osc_w) {
        while (term->osc_strlen--)
            term->wordness[(unsigned char)
                term->osc_string[term->osc_strlen]] = term->esc_args[0];
    } else {
        term->osc_string[term->osc_strlen] = '\0';
        switch (term->esc_args[0]) {
          case 0:
          case 1:
            if (!term->no_remote_wintitle) {
                sfree(term->icon_title);
                term->icon_title = dupstr(term->osc_string);
                term->icontitle_codepage = term->ucsdata->line_codepage;
                term->win_icon_title_pending = true;
                term_schedule_update(term);
            }
            if (term->esc_args[0] == 1)
                break;
            /* fall through: parameter 0 means set both */
          case 2:
          case 21:
            if (!term->no_remote_wintitle) {
                sfree(term->window_title);
                term->window_title = dupstr(term->osc_string);
                term->wintitle_codepage = term->ucsdata->line_codepage;
                term->win_title_pending = true;
                term_schedule_update(term);
            }
            break;
          case 4:
            if (term->ldisc && !strcmp(term->osc_string, "?")) {
                unsigned index = term->esc_args[1];
                if (index < OSC4_NCOLOURS) {
                    rgb colour = term->palette[index];
                    char *reply_buf = dupprintf(
                        "\033]4;%u;rgb:%04x/%04x/%04x\007", index,
                        (unsigned)colour.r * 0x0101,
                        (unsigned)colour.g * 0x0101,
                        (unsigned)colour.b * 0x0101);
                    ldisc_send(term->ldisc, reply_buf, strlen(reply_buf),
                               false);
                    sfree(reply_buf);
                }
            }
            break;
        }
    }
}